

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O0

uint addChunk_tRNS(ucvector *out,LodePNGColorMode *info)

{
  uint uVar1;
  ulong local_48;
  size_t amount;
  ucvector tRNS;
  size_t i;
  uint error;
  LodePNGColorMode *info_local;
  ucvector *out_local;
  
  ucvector_init((ucvector *)&amount);
  if (info->colortype == LCT_PALETTE) {
    local_48 = info->palettesize;
    tRNS.allocsize = info->palettesize;
    while ((tRNS.allocsize != 0 && (info->palette[(tRNS.allocsize - 1) * 4 + 3] == 0xff))) {
      local_48 = local_48 - 1;
      tRNS.allocsize = tRNS.allocsize - 1;
    }
    for (tRNS.allocsize = 0; tRNS.allocsize < local_48; tRNS.allocsize = tRNS.allocsize + 1) {
      ucvector_push_back((ucvector *)&amount,info->palette[tRNS.allocsize * 4 + 3]);
    }
  }
  else if (info->colortype == LCT_GREY) {
    if (info->key_defined != 0) {
      ucvector_push_back((ucvector *)&amount,(uchar)(info->key_r >> 8));
      ucvector_push_back((ucvector *)&amount,(uchar)info->key_r);
    }
  }
  else if ((info->colortype == LCT_RGB) && (info->key_defined != 0)) {
    ucvector_push_back((ucvector *)&amount,(uchar)(info->key_r >> 8));
    ucvector_push_back((ucvector *)&amount,(uchar)info->key_r);
    ucvector_push_back((ucvector *)&amount,(uchar)(info->key_g >> 8));
    ucvector_push_back((ucvector *)&amount,(uchar)info->key_g);
    ucvector_push_back((ucvector *)&amount,(uchar)(info->key_b >> 8));
    ucvector_push_back((ucvector *)&amount,(uchar)info->key_b);
  }
  uVar1 = addChunk(out,"tRNS",(uchar *)amount,(size_t)tRNS.data);
  ucvector_cleanup(&amount);
  return uVar1;
}

Assistant:

static unsigned addChunk_tRNS(ucvector* out, const LodePNGColorMode* info)
{
  unsigned error = 0;
  size_t i;
  ucvector tRNS;
  ucvector_init(&tRNS);
  if(info->colortype == LCT_PALETTE)
  {
    size_t amount = info->palettesize;
    /*the tail of palette values that all have 255 as alpha, does not have to be encoded*/
    for(i = info->palettesize; i > 0; i--)
    {
      if(info->palette[4 * (i - 1) + 3] == 255) amount--;
      else break;
    }
    /*add only alpha channel*/
    for(i = 0; i < amount; i++) ucvector_push_back(&tRNS, info->palette[4 * i + 3]);
  }
  else if(info->colortype == LCT_GREY)
  {
    if(info->key_defined)
    {
      ucvector_push_back(&tRNS, (unsigned char)(info->key_r / 256));
      ucvector_push_back(&tRNS, (unsigned char)(info->key_r % 256));
    }
  }
  else if(info->colortype == LCT_RGB)
  {
    if(info->key_defined)
    {
      ucvector_push_back(&tRNS, (unsigned char)(info->key_r / 256));
      ucvector_push_back(&tRNS, (unsigned char)(info->key_r % 256));
      ucvector_push_back(&tRNS, (unsigned char)(info->key_g / 256));
      ucvector_push_back(&tRNS, (unsigned char)(info->key_g % 256));
      ucvector_push_back(&tRNS, (unsigned char)(info->key_b / 256));
      ucvector_push_back(&tRNS, (unsigned char)(info->key_b % 256));
    }
  }

  error = addChunk(out, "tRNS", tRNS.data, tRNS.size);
  ucvector_cleanup(&tRNS);

  return error;
}